

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
basic_json<int,void>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,int *val
          )

{
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffe0;
  
  json_type_traits<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_int,_void>
  ::to_json((int)((ulong)in_RDI >> 0x20));
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffffe0,in_RDI);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x27eaf0)
  ;
  return;
}

Assistant:

basic_json(const T& val)
            : basic_json(json_type_traits<basic_json,T>::to_json(val))
        {
        }